

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  bool bVar1;
  _Bool _Var2;
  sysbvm_tuple_t *psVar3;
  sysbvm_tuple_t sVar4;
  size_t sVar5;
  size_t local_210;
  size_t i_2;
  size_t applicationArgumentCount_2;
  size_t i_1;
  size_t applicationArgumentCount_1;
  sysbvm_stackFrameGCRootsRecord_t callFrameStackRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  size_t sStack_118;
  _Bool isMacro;
  size_t i;
  size_t applicationArgumentCount;
  undefined1 auStack_100 [7];
  _Bool hasReceiver;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_128_16_03cfd29a gcFrame;
  sysbvm_astMessageSendNode_t **sendNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar3 = arguments + 1;
  gcFrame.result = (sysbvm_tuple_t)arguments;
  memset(&gcFrameRecord.roots,0,0x80);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = 0x10;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  _auStack_100 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*(long *)gcFrame.result + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_100);
  bVar1 = false;
  if (*(long *)(*(long *)gcFrame.result + 0x28) == 0) {
    gcFrame.receiverType =
         sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x38),*psVar3);
    _Var2 = sysbvm_environment_lookSymbolRecursively
                      (context,*psVar3,gcFrame.receiverType,&gcFrame.method);
    if ((!_Var2) || (_Var2 = sysbvm_symbolBinding_isValue(context,gcFrame.method), !_Var2)) {
      sysbvm_error("Failed to find symbol for message send without receiver.");
    }
    gcFrame.selector = sysbvm_symbolValueBinding_getValue(gcFrame.method);
  }
  else {
    gcFrameRecord.roots =
         (sysbvm_tuple_t *)
         sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x28),*psVar3);
    bVar1 = true;
    if (*(long *)(*(long *)gcFrame.result + 0x30) == 0) {
      gcFrame.receiver = sysbvm_tuple_getType(context,(sysbvm_tuple_t)gcFrameRecord.roots);
    }
    else {
      gcFrame.receiver =
           sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                     (context,*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x30),*psVar3);
    }
    sVar4 = sysbvm_tuple_getType(context,gcFrame.receiver);
    gcFrame.methodBinding =
         sysbvm_type_getAnalyzeAndEvaluateMessageSendNodeForReceiverWithEnvironmentFunction
                   (context,sVar4);
    if (gcFrame.methodBinding != 0) {
      gcFrame.message =
           sysbvm_function_apply4
                     (context,gcFrame.methodBinding,gcFrame.receiver,*arguments,
                      (sysbvm_tuple_t)gcFrameRecord.roots,*psVar3);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_100);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      return gcFrame.message;
    }
    gcFrame.receiverType =
         sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x38),*psVar3);
    gcFrame.selector =
         sysbvm_type_lookupMacroSelector(context,gcFrame.receiver,gcFrame.receiverType);
    if (gcFrame.selector == 0) {
      gcFrame.selector = sysbvm_type_lookupSelector(context,gcFrame.receiver,gcFrame.receiverType);
    }
    if (gcFrame.selector == 0) {
      gcFrame.selector =
           sysbvm_type_lookupFallbackSelector(context,gcFrame.receiver,gcFrame.receiverType);
    }
    if (gcFrame.selector == 0) {
      sVar5 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x40));
      gcFrame.selector =
           sysbvm_type_lookupMacroSelector
                     (context,gcFrame.receiver,(context->roots).doesNotUnderstandSelector);
      if (gcFrame.selector == 0) {
        gcFrame.selector =
             sysbvm_type_lookupSelector
                       (context,gcFrame.receiver,(context->roots).doesNotUnderstandSelector);
      }
      if (gcFrame.selector == 0) {
        gcFrame.selector =
             sysbvm_type_lookupFallbackSelector
                       (context,gcFrame.receiver,(context->roots).doesNotUnderstandSelector);
      }
      if (gcFrame.selector == 0) {
        sysbvm_error("Message not understood.");
      }
      _Var2 = sysbvm_function_isMacro(context,gcFrame.selector);
      if (!_Var2) {
        gcFrame.messageNode = (sysbvm_astMessageSendNode_t *)sysbvm_array_create(context,sVar5);
        for (sStack_118 = 0; sStack_118 < sVar5; sStack_118 = sStack_118 + 1) {
          gcFrame.arguments =
               sysbvm_array_at(*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x40),sStack_118);
          gcFrame.argumentNode =
               sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                         (context,gcFrame.arguments,*psVar3);
          sysbvm_array_atPut(gcFrame.argumentNode,sStack_118,gcFrame.argumentNode);
        }
        gcFrame.argument =
             sysbvm_message_create
                       (context,gcFrame.receiverType,(sysbvm_tuple_t)gcFrame.messageNode,
                        gcFrame.receiver,*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x10));
        gcFrame.message =
             sysbvm_function_applyNoCheck2
                       (context,gcFrame.selector,(sysbvm_tuple_t)gcFrameRecord.roots,
                        gcFrame.argument);
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_100);
        sysbvm_stackFrame_popRecord
                  ((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
        return gcFrame.message;
      }
      gcFrame.analysisAndEvaluationFunction =
           sysbvm_macroContext_create
                     (context,*arguments,*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x10),*psVar3
                     );
      gcFrame.selectorLiteralNode =
           sysbvm_context_shallowCopy(context,*(sysbvm_tuple_t *)gcFrame.result);
      sVar4 = sysbvm_astNode_getSourcePosition(*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x28));
      gcFrame.expansionResult =
           sysbvm_astLiteralNode_create(context,sVar4,(sysbvm_tuple_t)gcFrameRecord.roots);
      *(sysbvm_tuple_t *)(gcFrame.selectorLiteralNode + 0x28) = gcFrame.expansionResult;
      sVar4 = sysbvm_astNode_getSourcePosition(*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x38));
      gcFrame.receiverLiteralNode = sysbvm_astLiteralNode_create(context,sVar4,gcFrame.receiverType)
      ;
      *(sysbvm_tuple_t *)(gcFrame.selectorLiteralNode + 0x38) = gcFrame.receiverLiteralNode;
      gcFrame.macroContext =
           sysbvm_function_apply3
                     (context,gcFrame.selector,gcFrame.analysisAndEvaluationFunction,
                      gcFrame.expansionResult,gcFrame.selectorLiteralNode);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_100);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      sVar4 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                        (context,gcFrame.macroContext,*psVar3);
      return sVar4;
    }
  }
  callFrameStack.gcRoots.applicationArguments[0xf]._7_1_ =
       sysbvm_function_isMacro(context,gcFrame.selector);
  memset(&callFrameStackRecord.roots,0,0xb0);
  memset(&applicationArgumentCount_1,0,0x20);
  callFrameStackRecord.previous._0_4_ = 0;
  callFrameStackRecord.type = 0x11;
  callFrameStackRecord._12_4_ = 0;
  callFrameStackRecord.rootCount = (size_t)&callFrameStack.argumentIndex;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount_1);
  if ((callFrameStack.gcRoots.applicationArguments[0xf]._7_1_ & 1) == 0) {
    sVar5 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x40));
    sysbvm_functionCallFrameStack_begin
              (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,
               gcFrame.selector,sVar5 + (long)(int)(uint)bVar1,0);
    if (bVar1) {
      sysbvm_functionCallFrameStack_push
                ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,
                 (sysbvm_tuple_t)gcFrameRecord.roots);
    }
    for (local_210 = 0; local_210 < sVar5; local_210 = local_210 + 1) {
      gcFrame.arguments =
           sysbvm_array_at(*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x40),local_210);
      gcFrame.argumentNode =
           sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                     (context,gcFrame.arguments,*psVar3);
      sysbvm_functionCallFrameStack_push
                ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,gcFrame.argumentNode
                );
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount_1);
    gcFrame.message =
         sysbvm_functionCallFrameStack_finish
                   (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_100);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)gcFrame.message;
  }
  else {
    sVar5 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x40));
    sysbvm_functionCallFrameStack_begin
              (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,
               gcFrame.selector,sVar5 + 1 + (long)(int)(uint)bVar1,0);
    gcFrame.analysisAndEvaluationFunction =
         sysbvm_macroContext_create
                   (context,*arguments,*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x10),*psVar3);
    sysbvm_functionCallFrameStack_push
              ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,
               gcFrame.analysisAndEvaluationFunction);
    if (bVar1) {
      sVar4 = sysbvm_astNode_getSourcePosition(*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x28));
      gcFrame.expansionResult =
           sysbvm_astLiteralNode_create(context,sVar4,(sysbvm_tuple_t)gcFrameRecord.roots);
      sysbvm_functionCallFrameStack_push
                ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,
                 gcFrame.expansionResult);
    }
    for (applicationArgumentCount_2 = 0; applicationArgumentCount_2 < sVar5;
        applicationArgumentCount_2 = applicationArgumentCount_2 + 1) {
      sVar4 = sysbvm_array_at(*(sysbvm_tuple_t *)(*(long *)gcFrame.result + 0x40),
                              applicationArgumentCount_2);
      sysbvm_functionCallFrameStack_push
                ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,sVar4);
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount_1);
    gcFrame.macroContext =
         sysbvm_functionCallFrameStack_finish
                   (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_100);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local =
         (sysbvm_context_t *)
         sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                   (context,gcFrame.macroContext,*psVar3);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageSendNode_t **sendNode = (sysbvm_astMessageSendNode_t**)node;

    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t method;
        sysbvm_tuple_t methodBinding;

        sysbvm_tuple_t analysisAndEvaluationFunction;
        sysbvm_tuple_t macroContext;
        sysbvm_tuple_t expansionResult;
        sysbvm_tuple_t receiverLiteralNode;
        sysbvm_tuple_t selectorLiteralNode;
        sysbvm_astMessageSendNode_t *messageNode;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t message;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*sendNode)->super.sourcePosition);

    bool hasReceiver = false;
    if((*sendNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->receiver, *environment);
        hasReceiver = true;

        if((*sendNode)->receiverLookupType)
            gcFrame.receiverType = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->receiverLookupType, *environment);
        else
            gcFrame.receiverType = sysbvm_tuple_getType(context, gcFrame.receiver);
        gcFrame.analysisAndEvaluationFunction = sysbvm_type_getAnalyzeAndEvaluateMessageSendNodeForReceiverWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.receiverType));
        if(gcFrame.analysisAndEvaluationFunction)
        {
            gcFrame.result = sysbvm_function_apply4(context, gcFrame.analysisAndEvaluationFunction, gcFrame.receiverType, *node, gcFrame.receiver, *environment);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return gcFrame.result;
        }

        gcFrame.selector = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->selector, *environment);
        gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
            gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
            gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
        {
            size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
            gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                sysbvm_error("Message not understood.");

            // Does not understand: 
            if(sysbvm_function_isMacro(context, gcFrame.method))
            {
                gcFrame.macroContext = sysbvm_macroContext_create(context, *node, (*sendNode)->super.sourcePosition, *environment);
                gcFrame.messageNode = (sysbvm_astMessageSendNode_t *)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)*sendNode);

                gcFrame.receiverLiteralNode = sysbvm_astLiteralNode_create(context, sysbvm_astNode_getSourcePosition((*sendNode)->receiver), gcFrame.receiver);
                gcFrame.messageNode->receiver = gcFrame.receiverLiteralNode;

                gcFrame.selectorLiteralNode = sysbvm_astLiteralNode_create(context, sysbvm_astNode_getSourcePosition((*sendNode)->selector), gcFrame.selector);
                gcFrame.messageNode->selector = gcFrame.selectorLiteralNode;

                gcFrame.expansionResult = sysbvm_function_apply3(context, gcFrame.method, gcFrame.macroContext, gcFrame.receiverLiteralNode, (sysbvm_tuple_t)gcFrame.messageNode);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

                // Analyze and evaluate the resulting node.
                return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionResult, *environment);
            }
            else
            {
                gcFrame.arguments = sysbvm_array_create(context, applicationArgumentCount);
                for(size_t i = 0; i < applicationArgumentCount; ++i)
                {
                    gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
                    gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
                    sysbvm_array_atPut(gcFrame.argument, i, gcFrame.argument);
                }

                gcFrame.message = sysbvm_message_create(context, gcFrame.selector, gcFrame.arguments, gcFrame.receiverType, (*sendNode)->super.sourcePosition);
                gcFrame.result = sysbvm_function_applyNoCheck2(context, gcFrame.method, gcFrame.receiver, gcFrame.message);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                return gcFrame.result;
            }
        }
    }
    else
    {
        gcFrame.selector = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->selector, *environment);
        if(!sysbvm_environment_lookSymbolRecursively(context, *environment, gcFrame.selector, &gcFrame.methodBinding)
            || !sysbvm_symbolBinding_isValue(context, gcFrame.methodBinding))
            sysbvm_error("Failed to find symbol for message send without receiver.");
        gcFrame.method = sysbvm_symbolValueBinding_getValue(gcFrame.methodBinding);
    }

    bool isMacro = sysbvm_function_isMacro(context, gcFrame.method);
    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    if(isMacro)
    {
        size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
        sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.method, 1 + applicationArgumentCount + (hasReceiver ? 1 : 0), 0);

        gcFrame.macroContext = sysbvm_macroContext_create(context, *node, (*sendNode)->super.sourcePosition, *environment);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.macroContext);

        // We need to push the receiver as a node, so wrap it in a literal node here.
        if(hasReceiver)
        {
            gcFrame.receiverLiteralNode = sysbvm_astLiteralNode_create(context, sysbvm_astNode_getSourcePosition((*sendNode)->receiver), gcFrame.receiver);
            sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.receiverLiteralNode);
        }

        // Push the argument nodes.
        for(size_t i = 0; i < applicationArgumentCount; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at((*sendNode)->arguments, i));

        SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
        gcFrame.expansionResult = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

        // Analyze and evaluate the resulting node.
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionResult, *environment);
    }
    else
    {
        size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
        sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.method, applicationArgumentCount + (hasReceiver ? 1 : 0), 0);

        if(hasReceiver)
            sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.receiver);

        for(size_t i = 0; i < applicationArgumentCount; ++i)
        {
            gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
            gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
            sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argument);
        }

        SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
        gcFrame.result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
}